

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O3

TokenType __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
matchNextToken(Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
               *this)

{
  UTF8Reader *pUVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  bool bVar4;
  UnicodeChar UVar5;
  int iVar6;
  UnicodeChar UVar7;
  TokenType TVar8;
  uint uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  UTF8Reader temp;
  UTF8Reader end;
  UTF8Reader temp_4;
  CompileMessage local_a0;
  UTF8Reader local_68 [2];
  long local_58 [2];
  UTF8Reader *local_48;
  UTF8Reader local_40;
  UTF8Reader local_38;
  
  pUVar1 = &this->input;
  UVar5 = UTF8Reader::operator*(pUVar1);
  if ((UVar5 & 0xffffffdf) - 0x41 < 0x1a) {
    local_68[0].data = pUVar1->data;
    local_48 = pUVar1;
    UTF8Reader::operator++(local_68);
    UVar5 = UTF8Reader::operator*(local_68);
    if (((UVar5 == 0x5f) || (UVar5 - 0x30 < 10)) || (uVar9 = 1, (UVar5 & 0xffffffdf) - 0x41 < 0x1a))
    {
      uVar9 = 1;
      do {
        if (0xff < uVar9) {
          CompileMessageHelpers::createMessage<>(&local_a0,syntax,error,"Identifier too long");
          (*this->_vptr_Tokeniser[2])(this,&local_a0);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a0.location.sourceCode.object);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0.description._M_dataplus._M_p != &local_a0.description.field_2) {
            operator_delete(local_a0.description._M_dataplus._M_p,
                            local_a0.description.field_2._M_allocated_capacity + 1);
          }
        }
        UTF8Reader::operator++(local_68);
        UVar5 = UTF8Reader::operator*(local_68);
        uVar9 = uVar9 + 1;
      } while (((UVar5 == 0x5f) || (UVar5 - 0x30 < 10)) || ((UVar5 & 0xffffffdf) - 0x41 < 0x1a));
    }
    pUVar1 = local_48;
    local_38.data = local_48->data;
    TVar8 = Keyword::Matcher::match(uVar9,&local_38);
    if (TVar8.text != (char *)0x0) {
      UTF8Reader::operator+=(pUVar1,uVar9);
      return (TokenType)TVar8.text;
    }
    paVar2 = &local_a0.description.field_2;
    local_a0.description._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,pUVar1->data,local_68[0].data);
    std::__cxx11::string::operator=((string *)&this->currentStringValue,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.description._M_dataplus._M_p != paVar2) {
      operator_delete(local_a0.description._M_dataplus._M_p,
                      local_a0.description.field_2._M_allocated_capacity + 1);
    }
    pUVar1->data = local_68[0].data;
    return (TokenType)"$identifier";
  }
  if ((byte)(*pUVar1->data - 0x30U) < 10) {
    TVar8 = parseNumericLiteral(this,false);
    return (TokenType)TVar8.text;
  }
  if (UVar5 == 0x2d) {
    local_a0.description._M_dataplus._M_p = pUVar1->data;
    UTF8Reader::operator++((UTF8Reader *)&local_a0);
    if ((byte)(*local_a0.description._M_dataplus._M_p - 0x30U) < 10) {
      UTF8Reader::operator++(pUVar1);
      TVar8 = parseNumericLiteral(this,true);
      if ((TVar8.text != "$integer32") &&
         ((TVar8.text == (char *)0x0 ||
          (((iVar6 = strcmp(TVar8.text,"$integer32"), TVar8.text != "$integer64" && (iVar6 != 0)) &&
           (iVar6 = strcmp(TVar8.text,"$integer64"), iVar6 != 0)))))) {
        this->literalDoubleValue = -this->literalDoubleValue;
        return (TokenType)TVar8.text;
      }
      this->literalIntValue = -this->literalIntValue;
      return (TokenType)TVar8.text;
    }
  }
  else {
    bVar4 = parseStringLiteral(this,UVar5);
    if (bVar4) {
      return (TokenType)"$string literal";
    }
    if (UVar5 == 0x2f) {
      if (this->shouldIgnoreComments == false) {
        local_a0.description._M_dataplus._M_p = pUVar1->data;
        UTF8Reader::operator++((UTF8Reader *)&local_a0);
        UVar7 = UTF8Reader::operator*((UTF8Reader *)&local_a0);
        if (UVar7 == 0x2a) {
          local_a0.description._M_dataplus._M_p = (this->input).data;
          (this->location).location.data = local_a0.description._M_dataplus._M_p;
          uVar9 = 3;
          do {
            UTF8Reader::operator++((UTF8Reader *)&local_a0);
            uVar9 = uVar9 - 1;
          } while (1 < uVar9);
          UTF8Reader::find(local_68,(char *)&local_a0);
          if (*local_68[0].data == '\0') {
            CompileMessageHelpers::createMessage<>
                      (&local_a0,syntax,error,"Unterminated \'/*\' comment");
            (*this->_vptr_Tokeniser[2])(this,&local_a0);
            CompileMessage::~CompileMessage(&local_a0);
          }
          uVar9 = 3;
          do {
            UTF8Reader::operator++(local_68);
            uVar9 = uVar9 - 1;
          } while (1 < uVar9);
          local_a0.description._M_dataplus._M_p = (pointer)&local_a0.description.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,pUVar1->data,local_68[0].data);
        }
        else {
          if (UVar7 != 0x2f) goto LAB_0024e79d;
          UTF8Reader::find(local_68,(char *)pUVar1);
          local_a0.description._M_dataplus._M_p = (pointer)&local_a0.description.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,(this->input).data,local_68[0].data);
        }
        std::__cxx11::string::operator=((string *)&this->currentStringValue,(string *)&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.description._M_dataplus._M_p != &local_a0.description.field_2) {
          operator_delete(local_a0.description._M_dataplus._M_p,
                          local_a0.description.field_2._M_allocated_capacity + 1);
        }
        pUVar1->data = local_68[0].data;
        return (TokenType)"$comment";
      }
    }
    else if ((UVar5 == 0x2e) && (bVar4 = parseFloatLiteral(this), bVar4)) {
      return (TokenType)(this->literalType).text;
    }
  }
LAB_0024e79d:
  TVar8 = StandardOperatorMatcher::match(pUVar1);
  if (TVar8.text != (char *)0x0) {
    return (TokenType)TVar8.text;
  }
  if (UVar5 == 0x5f) {
    local_a0.description._M_dataplus._M_p = pUVar1->data;
    UTF8Reader::operator++((UTF8Reader *)&local_a0);
    UVar5 = UTF8Reader::operator*((UTF8Reader *)&local_a0);
    if (((UVar5 == 0x5f) || (UVar5 - 0x30 < 10)) || ((UVar5 & 0xffffffdf) - 0x41 < 0x1a)) {
      CompileMessageHelpers::createMessage<>
                (&local_a0,syntax,error,
                 "Identifiers beginning with an underscore are reserved for system use");
      (*this->_vptr_Tokeniser[2])(this,&local_a0);
      CompileMessage::~CompileMessage(&local_a0);
    }
  }
  pcVar3 = pUVar1->data;
  if (*pcVar3 == '\0') {
    return (TokenType)"$eof";
  }
  local_40.data = pcVar3;
  UTF8Reader::operator++(&local_40);
  local_68[0].data = (char *)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,pcVar3,local_40.data);
  CompileMessageHelpers::createMessage<std::__cxx11::string>
            (&local_a0,(CompileMessageHelpers *)0x1,none,0x25a00e,(char *)local_68,in_R9);
  (*this->_vptr_Tokeniser[2])(this,&local_a0);
  CompileMessage::~CompileMessage(&local_a0);
  if ((long *)local_68[0].data == local_58) {
    return (TokenType)"$eof";
  }
  operator_delete(local_68[0].data,local_58[0] + 1);
  return (TokenType)"$eof";
}

Assistant:

TokenType matchNextToken()
    {
        if (IdentifierMatcher::isIdentifierStart (*input))
        {
            auto end = input;
            int len = 1;

            while (IdentifierMatcher::isIdentifierBody (*++end))
                if (++len > (int) maxIdentifierLength)
                    throwError (Errors::identifierTooLong());

            if (auto keyword = KeywordList::match (len, input))
            {
                input += len;
                return keyword;
            }

            currentStringValue = std::string (input.getAddress(), end.getAddress());
            input = end;
            return IdentifierMatcher::categoriseIdentifier (currentStringValue);
        }

        if (input.isDigit())
            return parseNumericLiteral (false);

        auto currentChar = *input;

        if (currentChar == '-' && (input + 1).isDigit())
        {
            ++input;
            auto tok = parseNumericLiteral (true);

            if (tok == Token::literalInt32 || tok == Token::literalInt64)
                literalIntValue = -literalIntValue;
            else
                literalDoubleValue = -literalDoubleValue;

            return tok;
        }

        if (parseStringLiteral (currentChar))
            return Token::literalString;

        if (currentChar == '.' && parseFloatLiteral())
            return literalType;

        if (currentChar == '/' && ! shouldIgnoreComments)
        {
            auto c2 = *(input + 1);

            if (c2 == '/')
            {
                auto end = input.find ("\n");
                currentStringValue = std::string (input.getAddress(), end.getAddress());
                input = end;
                return Token::comment;
            }

            if (c2 == '*')
            {
                location.location = input;
                auto end = (input + 2).find ("*/");
                if (end.isEmpty()) throwError (Errors::unterminatedComment());
                end += 2;
                currentStringValue = std::string (input.getAddress(), end.getAddress());
                input = end;
                return Token::comment;
            }
        }

        if (auto op = OperatorList::match (input))
            return op;

        if (currentChar == '_' && IdentifierMatcher::isIdentifierBody (*(input + 1)))
            throwError (Errors::noLeadingUnderscoreAllowed());

        if (! input.isEmpty())
            throwError (Errors::illegalCharacter (std::string (input.getAddress(), (input + 1).getAddress())));

        return Token::eof;
    }